

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

void Randomize(Mat *m,float a,float b)

{
  size_t sVar1;
  void *pvVar2;
  unsigned_short uVar3;
  ulong uVar4;
  float fVar5;
  
  sVar1 = m->elemsize;
  if (sVar1 == 1) {
    if ((long)m->c * m->cstep != 0) {
      pvVar2 = m->data;
      uVar4 = 0;
      do {
        fVar5 = RandomFloat(-127.0,127.0);
        *(char *)((long)pvVar2 + uVar4) = (char)(int)fVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (long)m->c * m->cstep);
    }
  }
  else if (sVar1 == 2) {
    if ((long)m->c * m->cstep != 0) {
      pvVar2 = m->data;
      uVar4 = 0;
      do {
        fVar5 = RandomFloat(a,b);
        uVar3 = ncnn::float32_to_float16(fVar5);
        *(unsigned_short *)((long)pvVar2 + uVar4 * 2) = uVar3;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (long)m->c * m->cstep);
    }
  }
  else if ((sVar1 == 4) && ((long)m->c * m->cstep != 0)) {
    uVar4 = 0;
    do {
      fVar5 = RandomFloat(a,b);
      *(float *)((long)m->data + uVar4 * 4) = fVar5;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (long)m->c * m->cstep);
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -1.2f, float b = 1.2f)
{
    if (m.elemsize == 4)
    {
        for (size_t i = 0; i < m.total(); i++)
        {
            m[i] = RandomFloat(a, b);
        }
    }
    else if (m.elemsize == 2)
    {
        unsigned short* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = ncnn::float32_to_float16(RandomFloat(a, b));
        }
    }
    else if (m.elemsize == 1)
    {
        signed char* p = m;
        for (size_t i = 0; i < m.total(); i++)
        {
            p[i] = (signed char)RandomFloat(-127, 127);
        }
    }
}